

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O0

NamedPortConnectionSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::NamedPortConnectionSyntax,slang::syntax::SyntaxList<slang::syntax::AttributeInstanceSyntax>const&,slang::parsing::Token&,slang::parsing::Token&,slang::parsing::Token&,slang::syntax::PropertyExprSyntax*&,slang::parsing::Token&>
          (BumpAllocator *this,SyntaxList<slang::syntax::AttributeInstanceSyntax> *args,
          Token *args_1,Token *args_2,Token *args_3,PropertyExprSyntax **args_4,Token *args_5)

{
  Token name;
  Token openParen;
  NamedPortConnectionSyntax *pNVar1;
  undefined8 *in_RCX;
  Token *in_RDX;
  long in_R8;
  undefined8 *in_R9;
  Token *in_stack_00000008;
  size_t in_stack_ffffffffffffff68;
  size_t in_stack_ffffffffffffff70;
  BumpAllocator *in_stack_ffffffffffffff78;
  
  pNVar1 = (NamedPortConnectionSyntax *)
           allocate(in_stack_ffffffffffffff78,in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
  name.info = (Info *)pNVar1;
  name._0_8_ = in_stack_00000008->info;
  openParen.info = (Info *)*in_RCX;
  openParen._0_8_ = *(undefined8 *)(in_R8 + 8);
  slang::syntax::NamedPortConnectionSyntax::NamedPortConnectionSyntax
            (*(NamedPortConnectionSyntax **)in_stack_00000008,
             (SyntaxList<slang::syntax::AttributeInstanceSyntax> *)*in_R9,*in_stack_00000008,name,
             openParen,(PropertyExprSyntax *)in_RCX[1],*in_RDX);
  return pNVar1;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }